

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int GetAddrPortTypeFromDevPath
              (char *szDevPath,char *address,size_t addresslen,char *port,size_t portlen,
              int *pDevType)

{
  int iVar1;
  uint uVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  size_t tmplen;
  char *ptr2;
  char *ptr;
  int *pDevType_local;
  size_t portlen_local;
  char *port_local;
  size_t addresslen_local;
  char *address_local;
  char *szDevPath_local;
  
  tmplen = 0;
  if (((((szDevPath == (char *)0x0) || (address == (char *)0x0)) || (port == (char *)0x0)) ||
      ((pDevType == (int *)0x0 || (addresslen < 0x10)))) || (portlen < 6)) {
    szDevPath_local._4_4_ = 1;
  }
  else {
    *address = '\0';
    *port = '\0';
    *pDevType = 0;
    __s = strchr(szDevPath,0x3a);
    if ((__s != (char *)0x0) && (sVar3 = strlen(__s), 5 < sVar3)) {
      tmplen = (size_t)strchr(__s + 1,0x3a);
    }
    sVar3 = strlen(szDevPath);
    if ((((sVar3 < 0x15) || (iVar1 = strncmp(szDevPath,"tcp-connect:",0xc), iVar1 != 0)) ||
        (tmplen == 0)) || (*(char *)(tmplen + 1) == '\0')) {
      sVar3 = strlen(szDevPath);
      if (((sVar3 < 0x14) || (iVar1 = strncmp(szDevPath,"tcp-listen:",0xb), iVar1 != 0)) ||
         ((tmplen == 0 || (*(char *)(tmplen + 1) == '\0')))) {
        sVar3 = strlen(szDevPath);
        if (((sVar3 < 0x14) || (iVar1 = strncmp(szDevPath,"udp-listen:",0xb), iVar1 != 0)) ||
           ((tmplen == 0 || (*(char *)(tmplen + 1) == '\0')))) {
          sVar3 = strlen(szDevPath);
          if (((sVar3 < 0x12) ||
              (((iVar1 = strncmp(szDevPath,"tcpsrv://",9), iVar1 != 0 &&
                (iVar1 = strncmp(szDevPath,"tcpsvr://",9), iVar1 != 0)) || (tmplen == 0)))) ||
             (*(char *)(tmplen + 1) == '\0')) {
            sVar3 = strlen(szDevPath);
            if ((((sVar3 < 0x12) ||
                 ((iVar1 = strncmp(szDevPath,"udpsrv://",9), iVar1 != 0 &&
                  (iVar1 = strncmp(szDevPath,"udpsvr://",9), iVar1 != 0)))) || (tmplen == 0)) ||
               (*(char *)(tmplen + 1) == '\0')) {
              sVar3 = strlen(szDevPath);
              if (((sVar3 < 0x10) ||
                  ((iVar1 = strncmp(szDevPath,"tcpsrv:",7), iVar1 != 0 &&
                   (iVar1 = strncmp(szDevPath,"tcpsvr:",7), iVar1 != 0)))) ||
                 ((tmplen == 0 || (*(char *)(tmplen + 1) == '\0')))) {
                sVar3 = strlen(szDevPath);
                if ((sVar3 < 0x10) ||
                   ((((iVar1 = strncmp(szDevPath,"udpsrv:",7), iVar1 != 0 &&
                      (iVar1 = strncmp(szDevPath,"udpsvr:",7), iVar1 != 0)) || (tmplen == 0)) ||
                    (*(char *)(tmplen + 1) == '\0')))) {
                  sVar3 = strlen(szDevPath);
                  if ((((sVar3 < 0xf) || (iVar1 = strncmp(szDevPath,"tcp://",6), iVar1 != 0)) ||
                      (tmplen == 0)) || (*(char *)(tmplen + 1) == '\0')) {
                    sVar3 = strlen(szDevPath);
                    if (((sVar3 < 0xf) || (iVar1 = strncmp(szDevPath,"udp://",6), iVar1 != 0)) ||
                       ((tmplen == 0 || (*(char *)(tmplen + 1) == '\0')))) {
                      sVar3 = strlen(szDevPath);
                      if ((((sVar3 < 0xd) || (iVar1 = strncmp(szDevPath,"tcp:",4), iVar1 != 0)) ||
                          (tmplen == 0)) || (*(char *)(tmplen + 1) == '\0')) {
                        sVar3 = strlen(szDevPath);
                        if (((sVar3 < 0xd) || (iVar1 = strncmp(szDevPath,"udp:",4), iVar1 != 0)) ||
                           ((tmplen == 0 || (*(char *)(tmplen + 1) == '\0')))) {
                          sVar3 = strlen(szDevPath);
                          if ((sVar3 < 8) ||
                             (((iVar1 = strncmp(szDevPath,"tcpsrv:",7), iVar1 != 0 &&
                               (iVar1 = strncmp(szDevPath,"tcpsvr:",7), iVar1 != 0)) ||
                              (iVar1 = atoi(szDevPath + 4), iVar1 < 1)))) {
                            sVar3 = strlen(szDevPath);
                            if ((sVar3 < 8) ||
                               (((iVar1 = strncmp(szDevPath,"udpsrv:",7), iVar1 != 0 &&
                                 (iVar1 = strncmp(szDevPath,"udpsvr:",7), iVar1 != 0)) ||
                                (iVar1 = atoi(szDevPath + 4), iVar1 < 1)))) {
                              sVar3 = strlen(szDevPath);
                              if (((sVar3 < 5) || (iVar1 = strncmp(szDevPath,"tcp:",4), iVar1 != 0))
                                 || (iVar1 = atoi(szDevPath + 4), iVar1 < 1)) {
                                sVar3 = strlen(szDevPath);
                                if (((sVar3 < 5) ||
                                    (iVar1 = strncmp(szDevPath,"udp:",4), iVar1 != 0)) ||
                                   (iVar1 = atoi(szDevPath + 4), iVar1 < 1)) {
                                  if (((__s == (char *)0x0) || (*szDevPath != ':')) ||
                                     (iVar1 = atoi(szDevPath + 1), iVar1 < 1)) {
                                    if (((__s != (char *)0x0) && (iVar1 = atoi(__s + 1), 0 < iVar1))
                                       && (iVar1 = isdigit((uint)(byte)*szDevPath), iVar1 != 0)) {
                                      sVar3 = (long)__s - (long)szDevPath;
                                      if ((addresslen < sVar3 + 1) ||
                                         (sVar4 = strlen(__s + 1), portlen < sVar4 + 1)) {
                                        return 1;
                                      }
                                      memcpy(address,szDevPath,sVar3);
                                      address[sVar3 + 1] = '\0';
                                      uVar2 = atoi(__s + 1);
                                      sprintf(port,"%d",(ulong)uVar2);
                                      *pDevType = 1;
                                    }
                                  }
                                  else {
                                    sVar3 = strlen(szDevPath + 1);
                                    if (portlen < sVar3 + 1) {
                                      return 1;
                                    }
                                    strcpy(port,szDevPath + 1);
                                    *pDevType = 2;
                                  }
                                }
                                else {
                                  sVar3 = strlen(szDevPath + 4);
                                  if (portlen < sVar3 + 1) {
                                    return 1;
                                  }
                                  strcpy(port,szDevPath + 4);
                                  *pDevType = 4;
                                }
                              }
                              else {
                                sVar3 = strlen(szDevPath + 4);
                                if (portlen < sVar3 + 1) {
                                  return 1;
                                }
                                strcpy(port,szDevPath + 4);
                                *pDevType = 2;
                              }
                            }
                            else {
                              sVar3 = strlen(szDevPath + 7);
                              if (portlen < sVar3 + 1) {
                                return 1;
                              }
                              strcpy(port,szDevPath + 7);
                              *pDevType = 4;
                            }
                          }
                          else {
                            sVar3 = strlen(szDevPath + 7);
                            if (portlen < sVar3 + 1) {
                              return 1;
                            }
                            strcpy(port,szDevPath + 7);
                            *pDevType = 2;
                          }
                        }
                        else {
                          sVar3 = tmplen - (long)(szDevPath + 4);
                          if ((addresslen < sVar3 + 1) ||
                             (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                            return 1;
                          }
                          memcpy(address,szDevPath + 4,sVar3);
                          address[sVar3 + 1] = '\0';
                          strcpy(port,(char *)(tmplen + 1));
                          *pDevType = 3;
                        }
                      }
                      else {
                        sVar3 = tmplen - (long)(szDevPath + 4);
                        if ((addresslen < sVar3 + 1) ||
                           (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                          return 1;
                        }
                        memcpy(address,szDevPath + 4,sVar3);
                        address[sVar3 + 1] = '\0';
                        strcpy(port,(char *)(tmplen + 1));
                        *pDevType = 1;
                      }
                    }
                    else {
                      sVar3 = tmplen - (long)(szDevPath + 6);
                      if ((addresslen < sVar3 + 1) ||
                         (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                        return 1;
                      }
                      memcpy(address,szDevPath + 6,sVar3);
                      address[sVar3 + 1] = '\0';
                      strcpy(port,(char *)(tmplen + 1));
                      *pDevType = 3;
                    }
                  }
                  else {
                    sVar3 = tmplen - (long)(szDevPath + 6);
                    if ((addresslen < sVar3 + 1) ||
                       (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                      return 1;
                    }
                    memcpy(address,szDevPath + 6,sVar3);
                    address[sVar3 + 1] = '\0';
                    strcpy(port,(char *)(tmplen + 1));
                    *pDevType = 1;
                  }
                }
                else {
                  sVar3 = tmplen - (long)(szDevPath + 7);
                  if ((addresslen < sVar3 + 1) ||
                     (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                    return 1;
                  }
                  memcpy(address,szDevPath + 7,sVar3);
                  address[sVar3 + 1] = '\0';
                  strcpy(port,(char *)(tmplen + 1));
                  *pDevType = 4;
                }
              }
              else {
                sVar3 = tmplen - (long)(szDevPath + 7);
                if ((addresslen < sVar3 + 1) ||
                   (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                  return 1;
                }
                memcpy(address,szDevPath + 7,sVar3);
                address[sVar3 + 1] = '\0';
                strcpy(port,(char *)(tmplen + 1));
                *pDevType = 2;
              }
            }
            else {
              sVar3 = tmplen - (long)(szDevPath + 9);
              if ((addresslen < sVar3 + 1) ||
                 (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
                return 1;
              }
              memcpy(address,szDevPath + 9,sVar3);
              address[sVar3 + 1] = '\0';
              strcpy(port,(char *)(tmplen + 1));
              *pDevType = 4;
            }
          }
          else {
            sVar3 = tmplen - (long)(szDevPath + 9);
            if ((addresslen < sVar3 + 1) ||
               (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
              return 1;
            }
            memcpy(address,szDevPath + 9,sVar3);
            address[sVar3 + 1] = '\0';
            strcpy(port,(char *)(tmplen + 1));
            *pDevType = 2;
          }
        }
        else {
          sVar3 = tmplen - (long)(szDevPath + 0xb);
          if ((addresslen < sVar3 + 1) ||
             (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
            return 1;
          }
          memcpy(address,szDevPath + 0xb,sVar3);
          address[sVar3 + 1] = '\0';
          strcpy(port,(char *)(tmplen + 1));
          *pDevType = 4;
        }
      }
      else {
        sVar3 = tmplen - (long)(szDevPath + 0xb);
        if ((addresslen < sVar3 + 1) || (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1))
        {
          return 1;
        }
        memcpy(address,szDevPath + 0xb,sVar3);
        address[sVar3 + 1] = '\0';
        strcpy(port,(char *)(tmplen + 1));
        *pDevType = 2;
      }
    }
    else {
      sVar3 = tmplen - (long)(szDevPath + 0xc);
      if ((addresslen < sVar3 + 1) || (sVar4 = strlen((char *)(tmplen + 1)), portlen < sVar4 + 1)) {
        return 1;
      }
      memcpy(address,szDevPath + 0xc,sVar3);
      address[sVar3 + 1] = '\0';
      strcpy(port,(char *)(tmplen + 1));
      *pDevType = 1;
    }
    szDevPath_local._4_4_ = 0;
  }
  return szDevPath_local._4_4_;
}

Assistant:

inline int GetAddrPortTypeFromDevPath(char* szDevPath, char* address, size_t addresslen, char* port, size_t portlen, int* pDevType)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	size_t tmplen = 0;

	if ((szDevPath == NULL)||(address == NULL)||(port == NULL)||(pDevType == NULL)||(addresslen < 16)||(portlen < 6)) return EXIT_FAILURE;

	address[0] = 0;
	port[0] = 0;
	*pDevType = OTHER_DEV_TYPE_OSNET;

	ptr = strchr(szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');

	if ((strlen(szDevPath) >= 12+7+1+1)&&(strncmp(szDevPath, "tcp-connect:", strlen("tcp-connect:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+12);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+12, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 11+7+1+1)&&(strncmp(szDevPath, "tcp-listen:", strlen("tcp-listen:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+11);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+11, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 11+7+1+1)&&(strncmp(szDevPath, "udp-listen:", strlen("udp-listen:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+11);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+11, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 9+7+1+1)&&((strncmp(szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)||(strncmp(szDevPath, "tcpsvr://", strlen("tcpsvr://")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+9);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+9, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 9+7+1+1)&&((strncmp(szDevPath, "udpsrv://", strlen("udpsrv://")) == 0)||(strncmp(szDevPath, "udpsvr://", strlen("udpsvr://")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+9);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+9, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+7+1+1)&&((strncmp(szDevPath, "tcpsrv:", strlen("tcpsrv:")) == 0)||(strncmp(szDevPath, "tcpsvr:", strlen("tcpsvr:")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+7);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+7, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+7+1+1)&&((strncmp(szDevPath, "udpsrv:", strlen("udpsrv:")) == 0)||(strncmp(szDevPath, "udpsvr:", strlen("udpsvr:")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+7);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+7, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 6+7+1+1)&&(strncmp(szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+6);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+6, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 6+7+1+1)&&(strncmp(szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+6);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+6, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+7+1+1)&&(strncmp(szDevPath, "tcp:", strlen("tcp:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+4);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+4, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+7+1+1)&&(strncmp(szDevPath, "udp:", strlen("udp:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+4);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+4, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+1)&&((strncmp(szDevPath, "tcpsrv:", strlen("tcpsrv:")) == 0)||(strncmp(szDevPath, "tcpsvr:", strlen("tcpsvr:")) == 0))&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+7)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+7);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+1)&&((strncmp(szDevPath, "udpsrv:", strlen("udpsrv:")) == 0)||(strncmp(szDevPath, "udpsvr:", strlen("udpsvr:")) == 0))&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+7)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+7);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+1)&&(strncmp(szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+4)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+4);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+1)&&(strncmp(szDevPath, "udp:", strlen("udp:")) == 0)&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+4)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+4);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((ptr != NULL)&&(szDevPath[0] == ':')&&(atoi(szDevPath+1) > 0))
	{
		if (portlen < strlen(szDevPath+1)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((ptr != NULL)&&(atoi(ptr+1) > 0)&&(isdigit((unsigned char)szDevPath[0])))
	{
		tmplen = ptr-szDevPath;
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath, tmplen);
		address[tmplen+1] = 0;
		//strcpy(port, ptr+1);
		sprintf(port, "%d", atoi(ptr+1)); // Other non-digit characters may follow the port...
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}

	return EXIT_SUCCESS;
}